

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

AActor * P_SpawnPlayerMissile
                   (AActor *source,double x,double y,double z,PClassActor *type,DAngle *angle,
                   FTranslatedLineTarget *pLineTarget,AActor **pMissileActor,bool nofreeaim,
                   bool noautoaim,int aimflags)

{
  AWeapon *pAVar1;
  player_t *ppVar2;
  BYTE BVar3;
  bool bVar4;
  AActor *pAVar5;
  AActor *missile;
  undefined7 in_register_00000089;
  FTranslatedLineTarget *vrange;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  double dVar9;
  DVector2 v;
  FTranslatedLineTarget scratch;
  AActor *local_c0;
  AActor *local_b8;
  long local_98;
  undefined1 local_90 [8];
  undefined1 local_88 [40];
  DThinker *pDStack_60;
  DAngle local_50;
  FTranslatedLineTarget local_48;
  
  if ((int)CONCAT71(in_register_00000089,nofreeaim) == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0x40418000;
  }
  if (source == (AActor *)0x0) {
    pAVar5 = (AActor *)0x0;
  }
  else {
    vrange = &local_48;
    if (pLineTarget != (FTranslatedLineTarget *)0x0) {
      vrange = pLineTarget;
    }
    if (((source->player == (player_t *)0x0) ||
        (pAVar1 = source->player->ReadyWeapon, pAVar1 == (AWeapon *)0x0)) ||
       (((pAVar1->super_AInventory).field_0x4dd & 0x40) == 0 && !noautoaim)) {
      dVar9 = *(double *)((type->super_PClass).Defaults + 0x2c0);
      uVar7 = -(ulong)(0.0 < dVar9);
      local_88._32_8_ = ~uVar7 & 0x4090000000000000 | (ulong)(dVar9 * 64.0) & uVar7;
      pDStack_60 = (DThinker *)0x0;
      lVar6 = 0x10;
      while( true ) {
        local_b8 = (AActor *)
                   (*(double *)((long)P_SpawnPlayerMissile::angdiff + lVar6) + angle->Degrees);
        local_98 = (ulong)uVar8 << 0x20;
        local_90 = (undefined1  [8])local_b8;
        P_AimLineAttack((AActor *)local_88,(DAngle *)source,(double)local_88._32_8_,
                        (FTranslatedLineTarget *)local_90,(DAngle *)vrange,(int)&local_98,
                        (AActor *)(ulong)(uint)aimflags,(AActor *)0x0);
        local_c0 = (AActor *)local_88._0_8_;
        if (((source->player != (player_t *)0x0 && !nofreeaim) &&
            (bVar4 = FLevelLocals::IsFreelookAllowed(&level), bVar4)) &&
           (dVar9 = userinfo_t::GetAimDist(&source->player->userinfo), dVar9 <= 0.5)) break;
        pAVar5 = vrange->linetarget;
        if ((lVar6 == 0) || (lVar6 = lVar6 + -8, pAVar5 != (AActor *)0x0)) goto LAB_005550a4;
      }
      pAVar5 = vrange->linetarget;
LAB_005550a4:
      if ((pAVar5 == (AActor *)0x0) &&
         ((local_b8 = (AActor *)angle->Degrees, nofreeaim ||
          (bVar4 = FLevelLocals::IsFreelookAllowed(&level), !bVar4)))) {
        local_c0 = (AActor *)0x0;
      }
    }
    else {
      local_b8 = (AActor *)angle->Degrees;
      local_c0 = (AActor *)(source->Angles).Pitch.Degrees;
      vrange->linetarget = (AActor *)0x0;
    }
    if (((z != -2147483648.0) || (NAN(z))) && ((z != 2147483647.0 || (NAN(z))))) {
      ppVar2 = source->player;
      if (ppVar2 == (player_t *)0x0) {
        dVar9 = 4.0;
      }
      else {
        dVar9 = (ppVar2->mo->AttackZOffset + -4.0) * ppVar2->crouchfactor;
      }
      z = ((source->Height * 0.5 + (source->__Pos).Z) - source->Floorclip) + z + dVar9;
      if (z < source->floorz) {
        z = (double)source->floorz;
      }
    }
    P_GetOffsetPosition((source->__Pos).X,(source->__Pos).Y,x,y);
    local_88._16_8_ = z;
    missile = AActor::StaticSpawn(type,(DVector3 *)local_88,ALLOW_REPLACE,false);
    if (pMissileActor != (AActor **)0x0) {
      *pMissileActor = missile;
    }
    P_PlaySpawnSound(missile,source);
    (missile->target).field_0.p = source;
    (missile->Angles).Yaw.Degrees = (double)local_b8;
    if (((missile->flags3).Value & 3) == 0) {
      local_50.Degrees = (double)local_c0;
      AActor::Vel3DFromAngle(missile,&local_50,missile->Speed);
    }
    else {
      AActor::VelFromAngle(missile);
    }
    if (((missile->flags4).Value & 0x40000) != 0) {
      if (source->player == (player_t *)0x0) {
        BVar3 = '\0';
      }
      else {
        BVar3 = (char)((int)source->player - 0xa60290U >> 5) * '=' + '\x01';
      }
      missile->FriendPlayer = BVar3;
    }
    bVar4 = P_CheckMissileSpawn(missile,source->radius);
    pAVar5 = (AActor *)0x0;
    if (bVar4) {
      pAVar5 = missile;
    }
  }
  return pAVar5;
}

Assistant:

AActor *P_SpawnPlayerMissile (AActor *source, double x, double y, double z,
							  PClassActor *type, DAngle angle, FTranslatedLineTarget *pLineTarget, AActor **pMissileActor,
							  bool nofreeaim, bool noautoaim, int aimflags)
{
	static const double angdiff[3] = { -5.625, 5.625, 0 };
	DAngle an = angle;
	DAngle pitch;
	FTranslatedLineTarget scratch;
	AActor *defaultobject = GetDefaultByType(type);
	DAngle vrange = nofreeaim ? 35. : 0.;

	if (source == NULL)
	{
		return NULL;
	}
	if (!pLineTarget) pLineTarget = &scratch;
	if (source->player && source->player->ReadyWeapon && ((source->player->ReadyWeapon->WeaponFlags & WIF_NOAUTOAIM) || noautoaim))
	{
		// Keep exactly the same angle and pitch as the player's own aim
		an = angle;
		pitch = source->Angles.Pitch;
		pLineTarget->linetarget = NULL;
	}
	else // see which target is to be aimed at
	{
		// [XA] If MaxTargetRange is defined in the spawned projectile, use this as the
		//      maximum range for the P_AimLineAttack call later; this allows MaxTargetRange
		//      to function as a "maximum tracer-acquisition range" for seeker missiles.
		double linetargetrange = defaultobject->maxtargetrange > 0 ? defaultobject->maxtargetrange*64 : 16*64.;

		int i = 2;
		do
		{
			an = angle + angdiff[i];
			pitch = P_AimLineAttack (source, an, linetargetrange, pLineTarget, vrange, aimflags);
	
			if (source->player != NULL &&
				!nofreeaim &&
				level.IsFreelookAllowed() &&
				source->player->userinfo.GetAimDist() <= 0.5)
			{
				break;
			}
		} while (pLineTarget->linetarget == NULL && --i >= 0);

		if (pLineTarget->linetarget == NULL)
		{
			an = angle;
			if (nofreeaim || !level.IsFreelookAllowed())
			{
				pitch = 0.;
			}
		}
	}

	if (z != ONFLOORZ && z != ONCEILINGZ)
	{
		// Doom spawns missiles 4 units lower than hitscan attacks for players.
		z += source->Center() - source->Floorclip;
		if (source->player != NULL)	// Considering this is for player missiles, it better not be NULL.
		{
			z += ((source->player->mo->AttackZOffset - 4) * source->player->crouchfactor);
		}
		else
		{
			z += 4;
		}
		// Do not fire beneath the floor.
		if (z < source->floorz)
		{
			z = source->floorz;
		}
	}
	DVector3 pos = source->Vec2OffsetZ(x, y, z);
	AActor *MissileActor = Spawn (type, pos, ALLOW_REPLACE);
	if (pMissileActor) *pMissileActor = MissileActor;
	P_PlaySpawnSound(MissileActor, source);
	MissileActor->target = source;
	MissileActor->Angles.Yaw = an;
	if (MissileActor->flags3 & (MF3_FLOORHUGGER | MF3_CEILINGHUGGER))
	{
		MissileActor->VelFromAngle();
	}
	else
	{
		MissileActor->Vel3DFromAngle(pitch, MissileActor->Speed);
	}

	if (MissileActor->flags4 & MF4_SPECTRAL)
	{
		MissileActor->SetFriendPlayer(source->player);
	}
	if (P_CheckMissileSpawn (MissileActor, source->radius))
	{
		return MissileActor;
	}
	return NULL;
}